

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Finger.cpp
# Opt level: O2

bool __thiscall Finger::checkDists(Finger *this)

{
  bool bVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  Point local_48;
  Point local_40;
  Point local_38;
  Point local_30;
  Point local_28;
  Point local_20;
  
  bVar1 = true;
  if (this->shouldCheckDist == true) {
    iVar2 = (this->boundingBox).height / 5;
    local_20 = this->ptStart;
    local_28 = this->ptFar;
    dVar3 = getDist(&local_20,&local_28);
    local_30 = this->ptEnd;
    local_38 = this->ptFar;
    dVar4 = getDist(&local_30,&local_38);
    local_40 = this->ptStart;
    local_48 = this->ptEnd;
    dVar5 = getDist(&local_40,&local_48);
    bVar1 = false;
    if ((iVar2 < (int)dVar3) && (bVar1 = false, iVar2 < (int)dVar4)) {
      bVar1 = (int)dVar5 < (int)((double)iVar2 * 3.5);
    }
    this->ok = bVar1;
  }
  return bVar1;
}

Assistant:

bool Finger::checkDists() {
    if (!shouldCheckDist)
        return true;

    int minDist = boundingBox.height / 5;
    int maxDist = minDist * 3.5;

    int d1 = getDist(ptStart, ptFar);
    int d2 = getDist(ptEnd, ptFar);
    int d3 = getDist(ptStart, ptEnd);

    ok = (d1 > minDist && d2 > minDist)
         && (d3 < maxDist);
    return ok;
}